

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::init
          (BBoxRenderCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  code *pcVar2;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data_00;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data_01;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  data_02;
  bool bVar3;
  int iVar4;
  int y_;
  deUint32 dVar5;
  RenderContext *pRVar6;
  int extraout_var;
  RenderTarget *pRVar7;
  ContextInfo *pCVar8;
  NotSupportedError *pNVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  char *pcVar12;
  Context *pCVar13;
  ProgramSources *this_00;
  ShaderProgram *pSVar14;
  TestError *this_01;
  MovePtr *pMVar15;
  ObjectWrapper *pOVar16;
  size_type sVar17;
  reference pvVar18;
  Context *pCVar19;
  undefined8 in_stack_fffffffffffff668;
  vector<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
  *this_02;
  undefined4 in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff674;
  char *local_820;
  char *local_818;
  char *local_810;
  value_type local_7a8;
  uint local_768;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_> local_761;
  int iterationNdx;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  *local_750;
  undefined1 local_740 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_720;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *local_710;
  undefined1 local_700 [8];
  Texture colorAttachment;
  string local_6e0;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  ScopedLogSection local_670;
  ScopedLogSection section;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_660;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_650;
  string local_640 [32];
  string local_620;
  ShaderSource local_600;
  string local_5d8 [32];
  string local_5b8;
  ShaderSource local_598;
  string local_570 [32];
  string local_550;
  ShaderSource local_530;
  string local_508 [32];
  string local_4e8;
  ShaderSource local_4c8;
  string local_4a0 [32];
  string local_480;
  ShaderSource local_460;
  undefined1 local_438 [8];
  ProgramSources sources;
  char *local_360;
  char *local_358;
  char *local_350;
  MessageBuilder local_348;
  undefined1 local_1c5;
  int local_1c4;
  string local_1c0;
  int local_19c;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b2;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_8a;
  allocator<char> local_89;
  string local_88;
  undefined1 local_65;
  allocator<char> local_51;
  string local_50;
  deUint32 local_2c;
  ContextType local_28;
  byte local_21;
  bool supportsES32;
  IVec2 renderTargetSize;
  Functions *gl;
  BBoxRenderCase *this_local;
  
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  renderTargetSize.m_data[0] = (*pRVar6->_vptr_RenderContext[3])();
  renderTargetSize.m_data[1] = extraout_var;
  if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar4 = tcu::RenderTarget::getWidth(pRVar7);
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    y_ = tcu::RenderTarget::getHeight(pRVar7);
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffffe0,iVar4,y_);
  }
  else {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffffe0,0x200,0x200);
  }
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  local_28.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  local_2c = (deUint32)glu::ApiType::es(3,2);
  local_21 = glu::contextSupports(local_28,(ApiType)local_2c);
  if (!(bool)local_21) {
    pCVar8 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(pCVar8,"GL_EXT_primitive_bounding_box");
    if (!bVar3) {
      local_65 = 1;
      pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Test requires GL_EXT_primitive_bounding_box extension",
                 &local_51);
      tcu::NotSupportedError::NotSupportedError(pNVar9,&local_50);
      local_65 = 0;
      __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if (((local_21 & 1) == 0) && ((this->m_hasTessellationStage & 1U) != 0)) {
    pCVar8 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(pCVar8,"GL_EXT_tessellation_shader");
    if (!bVar3) {
      local_8a = 1;
      pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Test requires GL_EXT_tessellation_shader extension",&local_89)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar9,&local_88);
      local_8a = 0;
      __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if (((local_21 & 1) == 0) && ((this->m_hasGeometryStage & 1U) != 0)) {
    pCVar8 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(pCVar8,"GL_EXT_geometry_shader");
    if (!bVar3) {
      local_b2 = 1;
      pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Test requires GL_EXT_geometry_shader extension",&local_b1);
      tcu::NotSupportedError::NotSupportedError(pNVar9,&local_b0);
      local_b2 = 0;
      __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if ((this->m_renderTarget == RENDERTARGET_DEFAULT) &&
     ((iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffe0), iVar4 < 0x100 ||
      (iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffe0), iVar4 < 0x100))))
  {
    local_1c5 = 1;
    pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string((string *)&local_178);
    std::operator+(&local_158,&local_178,"Test requires ");
    local_19c = 0x100;
    de::toString<int>(&local_198,&local_19c);
    std::operator+(&local_138,&local_158,&local_198);
    std::operator+(&local_118,&local_138,"x");
    local_1c4 = 0x100;
    de::toString<int>(&local_1c0,&local_1c4);
    std::operator+(&local_f8,&local_118,&local_1c0);
    std::operator+(&local_d8,&local_f8," default framebuffer");
    tcu::NotSupportedError::NotSupportedError(pNVar9,&local_d8);
    local_1c5 = 0;
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_348,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      (&local_348,(char (*) [32])"Setting primitive bounding box ");
  if ((this->m_calcPerPrimitiveBBox & 1U) == 0) {
    if (this->m_bboxSize == BBOXSIZE_EQUAL) {
      local_818 = "to exactly cover rendered grid";
    }
    else {
      if (this->m_bboxSize == BBOXSIZE_LARGER) {
        local_820 = "to cover the grid and include some padding";
      }
      else {
        local_820 = (char *)0x0;
        if (this->m_bboxSize == BBOXSIZE_SMALLER) {
          local_820 = "to cover only a subset of the grid";
        }
      }
      local_818 = local_820;
    }
    local_810 = local_818;
  }
  else {
    local_810 = "to exactly cover each generated primitive";
  }
  local_350 = local_810;
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_350);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0xfb38cd);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [22])"Rendering with vertex");
  local_358 = "";
  if ((this->m_hasTessellationStage & 1U) != 0) {
    local_358 = "-tessellation{ctrl,eval}";
  }
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_358);
  local_360 = "";
  if ((this->m_hasGeometryStage & 1U) != 0) {
    local_360 = "-geometry";
  }
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_360);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])"-fragment program.\n");
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [24])"Set bounding box using ");
  pcVar12 = "gl_BoundingBoxEXT output";
  if ((this->m_useGlobalState & 1U) != 0) {
    pcVar12 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  }
  sources._200_8_ = pcVar12;
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char **)&sources.separable);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0xf12600);
  pMVar11 = tcu::MessageBuilder::operator<<
                      (pMVar11,(char (*) [63])
                               "Verifying rendering results are valid within the bounding box.");
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_348);
  glu::ProgramSources::ProgramSources((ProgramSources *)local_438);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar19 = pCVar1;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(local_4a0);
  pCVar13 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_480,(_anonymous_namespace_ *)pCVar1,pCVar13,(char *)pCVar19);
  glu::VertexSource::VertexSource((VertexSource *)&local_460,&local_480);
  glu::ProgramSources::operator<<((ProgramSources *)local_438,&local_460);
  glu::VertexSource::~VertexSource((VertexSource *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string(local_4a0);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar19 = pCVar1;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(local_508);
  pCVar13 = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_4e8,(_anonymous_namespace_ *)pCVar1,pCVar13,(char *)pCVar19);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_4c8,&local_4e8);
  glu::ProgramSources::operator<<((ProgramSources *)local_438,&local_4c8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string(local_508);
  if ((this->m_hasTessellationStage & 1U) != 0) {
    pCVar1 = (this->super_TestCase).m_context;
    pCVar19 = pCVar1;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(local_570);
    pCVar13 = (Context *)std::__cxx11::string::c_str();
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_550,(_anonymous_namespace_ *)pCVar1,pCVar13,(char *)pCVar19);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_530,&local_550);
    this_00 = glu::ProgramSources::operator<<((ProgramSources *)local_438,&local_530);
    pCVar1 = (this->super_TestCase).m_context;
    pCVar19 = pCVar1;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])(local_5d8);
    pCVar13 = (Context *)std::__cxx11::string::c_str();
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_5b8,(_anonymous_namespace_ *)pCVar1,pCVar13,(char *)pCVar19);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_598,&local_5b8);
    glu::ProgramSources::operator<<(this_00,&local_598);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_598);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string(local_5d8);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_530);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string(local_570);
  }
  if ((this->m_hasGeometryStage & 1U) != 0) {
    pCVar1 = (this->super_TestCase).m_context;
    pCVar19 = pCVar1;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])(local_640);
    pCVar13 = (Context *)std::__cxx11::string::c_str();
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_620,(_anonymous_namespace_ *)pCVar1,pCVar13,(char *)pCVar19);
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_600,&local_620);
    glu::ProgramSources::operator<<((ProgramSources *)local_438,&local_600);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_600);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string(local_640);
  }
  pSVar14 = (ShaderProgram *)operator_new(0xd0);
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ShaderProgram::ShaderProgram(pSVar14,pRVar6,(ProgramSources *)local_438);
  de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter
            ((DefaultDeleter<glu::ShaderProgram> *)((long)&section.m_log + 7));
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_660);
  local_650 = de::details::MovePtr::operator_cast_to_PtrData(&local_660,(MovePtr *)pSVar14);
  data_00._8_4_ = in_stack_fffffffffffff670;
  data_00.ptr = (ShaderProgram *)in_stack_fffffffffffff668;
  data_00._12_4_ = in_stack_fffffffffffff674;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
            (&this->m_program,data_00);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_660);
  dVar5 = (**(code **)((long)renderTargetSize.m_data + 0x800))();
  glu::checkError(dVar5,"build program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x2b4);
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"ShaderProgram",&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"Shader program",&local_6b9);
  tcu::ScopedLogSection::ScopedLogSection(&local_670,pTVar10,&local_690,&local_6b8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pSVar14 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator*(&(this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                     );
  glu::operator<<(pTVar10,pSVar14);
  tcu::ScopedLogSection::~ScopedLogSection(&local_670);
  pSVar14 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&(this->m_program).
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  bVar3 = glu::ShaderProgram::isOk(pSVar14);
  if (bVar3) {
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_438);
    if (this->m_renderTarget == RENDERTARGET_FBO) {
      pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
      glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)0> *)local_700,pRVar6);
      pcVar2 = *(code **)((long)renderTargetSize.m_data + 0xb8);
      dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_700);
      (*pcVar2)(0xde1,dVar5);
      (**(code **)((long)renderTargetSize.m_data + 0x1380))(0xde1,1,0x8058,0x200);
      dVar5 = (**(code **)((long)renderTargetSize.m_data + 0x800))();
      glu::checkError(dVar5,"gen tex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0x2c5);
      pMVar15 = (MovePtr *)operator_new(0x18);
      pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
      glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)3> *)pMVar15,pRVar6);
      de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>::DefaultDeleter
                ((DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_> *)
                 ((long)&data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      de::details::
      MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 *)&local_720);
      local_710 = de::details::MovePtr::operator_cast_to_PtrData(&local_720,pMVar15);
      data_01._8_4_ = in_stack_fffffffffffff670;
      data_01.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)in_stack_fffffffffffff668;
      data_01._12_4_ = in_stack_fffffffffffff674;
      de::details::
      MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::operator=(&this->m_fbo,data_01);
      de::details::
      MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                  *)&local_720);
      pcVar2 = *(code **)((long)renderTargetSize.m_data + 0x78);
      pOVar16 = &de::details::
                 UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 ::operator*(&(this->m_fbo).
                              super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                            )->super_ObjectWrapper;
      dVar5 = glu::ObjectWrapper::operator*(pOVar16);
      (*pcVar2)(0x8ca9,dVar5);
      pcVar2 = *(code **)((long)renderTargetSize.m_data + 0x6a0);
      dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_700);
      (*pcVar2)(0x8ca9,0x8ce0,0xde1,dVar5,0);
      dVar5 = (**(code **)((long)renderTargetSize.m_data + 0x800))();
      glu::checkError(dVar5,"attach",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0x2ca);
      (**(code **)((long)renderTargetSize.m_data + 0x78))(0x8ca9,0);
      glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)0> *)local_700);
    }
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_740);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
              (this,(vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                    local_740);
    pMVar15 = (MovePtr *)operator_new(0x18);
    pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)pMVar15,pRVar6);
    de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>::DefaultDeleter(&local_761);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
               *)&iterationNdx);
    local_750 = de::details::MovePtr::operator_cast_to_PtrData
                          ((PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                            *)&iterationNdx,pMVar15);
    data_02._8_4_ = in_stack_fffffffffffff670;
    data_02.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)in_stack_fffffffffffff668;
    data_02._12_4_ = in_stack_fffffffffffff674;
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::operator=(&this->m_vbo,data_02);
    de::details::
    MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                *)&iterationNdx);
    pcVar2 = *(code **)((long)renderTargetSize.m_data + 0x40);
    pOVar16 = &de::details::
               UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
               ::operator*(&(this->m_vbo).
                            super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                          )->super_ObjectWrapper;
    dVar5 = glu::ObjectWrapper::operator*(pOVar16);
    (*pcVar2)(0x8892,dVar5);
    pcVar2 = *(code **)((long)renderTargetSize.m_data + 0x150);
    sVar17 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_740);
    pvVar18 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_740,0);
    (*pcVar2)(0x8892,(long)((int)sVar17 << 4),pvVar18,0x88e4);
    dVar5 = (**(code **)((long)renderTargetSize.m_data + 0x800))();
    glu::checkError(dVar5,"create vbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x2d8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_740);
    for (local_768 = 0; (int)local_768 < this->m_numIterations; local_768 = local_768 + 1) {
      this_02 = &this->m_iterationConfigs;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                (&local_7a8,this,(ulong)local_768,&stack0xffffffffffffffe0);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
      ::push_back(this_02,&local_7a8);
    }
    return local_768;
  }
  colorAttachment.super_ObjectWrapper._22_1_ = 1;
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,"failed to build program",
             (allocator<char> *)&colorAttachment.super_ObjectWrapper.field_0x17);
  tcu::TestError::TestError(this_01,&local_6e0);
  colorAttachment.super_ObjectWrapper._22_1_ = 0;
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void BBoxRenderCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const tcu::IVec2		renderTargetSize	= (m_renderTarget == RENDERTARGET_DEFAULT) ?
													(tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) :
													(tcu::IVec2(FBO_SIZE, FBO_SIZE));
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements
	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (!supportsES32 && m_hasTessellationStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (!supportsES32 && m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_geometry_shader extension");
	if (m_renderTarget == RENDERTARGET_DEFAULT && (renderTargetSize.x() < RENDER_TARGET_MIN_SIZE || renderTargetSize.y() < RENDER_TARGET_MIN_SIZE))
		throw tcu::NotSupportedError(std::string() + "Test requires " + de::toString<int>(RENDER_TARGET_MIN_SIZE) + "x" + de::toString<int>(RENDER_TARGET_MIN_SIZE) + " default framebuffer");

	// log case specifics
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Setting primitive bounding box "
			<< ((m_calcPerPrimitiveBBox)         ? ("to exactly cover each generated primitive")
			  : (m_bboxSize == BBOXSIZE_EQUAL)   ? ("to exactly cover rendered grid")
			  : (m_bboxSize == BBOXSIZE_LARGER)  ? ("to cover the grid and include some padding")
			  : (m_bboxSize == BBOXSIZE_SMALLER) ? ("to cover only a subset of the grid")
			  : (DE_NULL))
			<< ".\n"
		<< "Rendering with vertex"
			<< ((m_hasTessellationStage) ? ("-tessellation{ctrl,eval}") : (""))
			<< ((m_hasGeometryStage) ? ("-geometry") : (""))
			<< "-fragment program.\n"
		<< "Set bounding box using "
			<< ((m_useGlobalState) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< "\n"
		<< "Verifying rendering results are valid within the bounding box."
		<< tcu::TestLog::EndMessage;

	// resources

	{
		glu::ProgramSources sources;
		sources << glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()));
		sources << glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()));

		if (m_hasTessellationStage)
			sources << glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource().c_str()))
					<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()));
		if (m_hasGeometryStage)
			sources << glu::GeometrySource(specializeShader(m_context, genGeometrySource().c_str()));

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
		GLU_EXPECT_NO_ERROR(gl.getError(), "build program");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "ShaderProgram", "Shader program");
			m_testCtx.getLog() << *m_program;
		}

		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}

	if (m_renderTarget == RENDERTARGET_FBO)
	{
		glu::Texture colorAttachment(m_context.getRenderContext());

		gl.bindTexture(GL_TEXTURE_2D, *colorAttachment);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

		m_fbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, **m_fbo);
		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *colorAttachment, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "attach");

		// unbind to prevent texture name deletion from removing it from current fbo attachments
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	}

	{
		std::vector<tcu::Vec4> data;

		getAttributeData(data);

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));
		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(data.size() * sizeof(tcu::Vec4)), &data[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "create vbo");
	}

	// Iterations
	for (int iterationNdx = 0; iterationNdx < m_numIterations; ++iterationNdx)
		m_iterationConfigs.push_back(generateConfig(iterationNdx, renderTargetSize));
}